

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.h
# Opt level: O2

int64_t disruptor::GetMinimumSequence
                  (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *sequences,
                  int64_t minimum)

{
  long *plVar1;
  
  for (plVar1 = *(long **)sequences; plVar1 != *(long **)(sequences + 8); plVar1 = plVar1 + 1) {
    if (*(long *)(*plVar1 + 0x38) <= minimum) {
      minimum = *(long *)(*plVar1 + 0x38);
    }
  }
  return minimum;
}

Assistant:

int64_t GetMinimumSequence(const std::vector<Sequence*>& sequences,
                           int64_t minimum = INT64_MAX) {
  for (Sequence* sequence_ : sequences) {
    const int64_t sequence = sequence_->sequence();
    minimum = minimum < sequence ? minimum : sequence;
  }

  return minimum;
}